

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::Clipper::DoMaxima(Clipper *this,TEdge *e)

{
  TEdge *e_00;
  clipperException *this_00;
  TEdge *local_28;
  TEdge *eNext;
  TEdge *eMaxPair;
  TEdge *e_local;
  Clipper *this_local;
  
  e_00 = GetMaximaPairEx(e);
  if (e_00 == (TEdge *)0x0) {
    if (-1 < e->OutIdx) {
      AddOutPt(this,e,&e->Top);
    }
    ClipperBase::DeleteFromAEL
              ((ClipperBase *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]),e);
  }
  else {
    local_28 = e->NextInAEL;
    while (local_28 != (TEdge *)0x0 && local_28 != e_00) {
      IntersectEdges(this,e,local_28,&e->Top);
      ClipperBase::SwapPositionsInAEL
                ((ClipperBase *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]),e,
                 local_28);
      local_28 = e->NextInAEL;
    }
    if ((e->OutIdx == -1) && (e_00->OutIdx == -1)) {
      ClipperBase::DeleteFromAEL
                ((ClipperBase *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]),e);
      ClipperBase::DeleteFromAEL
                ((ClipperBase *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]),e_00);
    }
    else if ((e->OutIdx < 0) || (e_00->OutIdx < 0)) {
      if (e->WindDelta != 0) {
        this_00 = (clipperException *)__cxa_allocate_exception(0x28);
        clipperException::clipperException(this_00,"DoMaxima error");
        __cxa_throw(this_00,&clipperException::typeinfo,clipperException::~clipperException);
      }
      if (-1 < e->OutIdx) {
        AddOutPt(this,e,&e->Top);
        e->OutIdx = -1;
      }
      ClipperBase::DeleteFromAEL
                ((ClipperBase *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]),e);
      if (-1 < e_00->OutIdx) {
        AddOutPt(this,e_00,&e->Top);
        e_00->OutIdx = -1;
      }
      ClipperBase::DeleteFromAEL
                ((ClipperBase *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]),e_00);
    }
    else {
      if (-1 < e->OutIdx) {
        AddLocalMaxPoly(this,e,e_00,&e->Top);
      }
      ClipperBase::DeleteFromAEL
                ((ClipperBase *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]),e);
      ClipperBase::DeleteFromAEL
                ((ClipperBase *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]),e_00);
    }
  }
  return;
}

Assistant:

void Clipper::DoMaxima(TEdge *e)
{
  TEdge* eMaxPair = GetMaximaPairEx(e);
  if (!eMaxPair)
  {
    if (e->OutIdx >= 0)
      AddOutPt(e, e->Top);
    DeleteFromAEL(e);
    return;
  }

  TEdge* eNext = e->NextInAEL;
  while(eNext && eNext != eMaxPair)
  {
    IntersectEdges(e, eNext, e->Top);
    SwapPositionsInAEL(e, eNext);
    eNext = e->NextInAEL;
  }

  if(e->OutIdx == Unassigned && eMaxPair->OutIdx == Unassigned)
  {
    DeleteFromAEL(e);
    DeleteFromAEL(eMaxPair);
  }
  else if( e->OutIdx >= 0 && eMaxPair->OutIdx >= 0 )
  {
    if (e->OutIdx >= 0) AddLocalMaxPoly(e, eMaxPair, e->Top);
    DeleteFromAEL(e);
    DeleteFromAEL(eMaxPair);
  }
#ifdef use_lines
  else if (e->WindDelta == 0)
  {
    if (e->OutIdx >= 0) 
    {
      AddOutPt(e, e->Top);
      e->OutIdx = Unassigned;
    }
    DeleteFromAEL(e);

    if (eMaxPair->OutIdx >= 0)
    {
      AddOutPt(eMaxPair, e->Top);
      eMaxPair->OutIdx = Unassigned;
    }
    DeleteFromAEL(eMaxPair);
  } 
#endif
  else throw clipperException("DoMaxima error");
}